

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,_3,_1> __thiscall
Matrix<double,3,3>::operator*(Matrix<double,3,3> *this,Matrix<double,_3,_1> *matrix)

{
  double dVar1;
  Matrix<double,_3,_1> MVar2;
  double *pdVar3;
  ostream *poVar4;
  int i;
  int row;
  int k;
  int col;
  int j;
  int col_00;
  double num;
  Matrix<double,_3,_1> local_40;
  
  if (matrix->rows == *(int *)(this + 4)) {
    local_40.rows = 3;
    local_40.cols = 1;
    local_40.data = (double *)operator_new__(0x18);
    for (row = 0; row < *(int *)this; row = row + 1) {
      for (col = 0; col < matrix->cols; col = col + 1) {
        num = 0.0;
        for (col_00 = 0; col_00 < *(int *)(this + 4); col_00 = col_00 + 1) {
          pdVar3 = Matrix<double,_3,_3>::operator()((Matrix<double,_3,_3> *)this,row,col_00);
          dVar1 = *pdVar3;
          pdVar3 = Matrix<double,_3,_1>::operator()(matrix,col_00,col);
          num = num + dVar1 * *pdVar3;
        }
        Matrix<double,_3,_1>::SetElement(&local_40,row,col,num);
      }
    }
    MVar2.data = local_40.data;
    MVar2.rows = local_40.rows;
    MVar2.cols = local_40.cols;
    return MVar2;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "you can not mutiply two matrix which the col of the first does not match the row of the second"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(-1);
}

Assistant:

int Matrix<Type, _0, _1>::row() const
{
    return this->rows;
}